

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O2

void __thiscall
estl::
vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
vector_s(vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
         *this,size_type count)

{
  pointer pvVar1;
  long lVar2;
  range_error *this_00;
  size_type sVar3;
  bool bVar4;
  
  this->size_ = 0;
  this->data_ptr_ = (pointer)this->data_;
  if (count < 0xb) {
    lVar2 = count * 0x20 + -0x10;
    sVar3 = count;
    while (bVar4 = sVar3 != 0, sVar3 = sVar3 - 1, bVar4) {
      pvVar1 = this->data_ptr_;
      *(long *)((long)pvVar1 + lVar2 + -0x10) = (long)&(pvVar1->_M_dataplus)._M_p + lVar2;
      *(undefined8 *)((long)pvVar1 + lVar2 + -8) = 0;
      *(undefined1 *)((long)&(pvVar1->_M_dataplus)._M_p + lVar2) = 0;
      lVar2 = lVar2 + -0x20;
    }
    this->size_ = count;
    return;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"cas::vector_s constructing beyond capacity.");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

explicit vector_s(size_type count)
    {
        if (count > capacity()) {
            ESTL_THROW(std::range_error, "cas::vector_s constructing beyond capacity.");
        }
        for (size_type i = count; i > 0; ) {
            --i;
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) T(); // NOTE: We use () instead of {} to be compatible with C++98
        }
        size_ = count;
    }